

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<char>::swap(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  SmallVectorImpl<char> *pSVar4;
  SmallVectorImpl<char> *pSVar5;
  void *pvVar6;
  void *pvVar7;
  void *__tmp;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong Size;
  
  if (this != RHS) {
    pSVar4 = (SmallVectorImpl<char> *)
             (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if ((pSVar4 == this + 1) ||
       (pSVar5 = (SmallVectorImpl<char> *)
                 (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
       pSVar5 == RHS + 1)) {
      uVar10 = (RHS->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar10) {
        SmallVectorTemplateBase<char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<char,_true>,(ulong)uVar10);
      }
      uVar10 = (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((RHS->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar10) {
        SmallVectorTemplateBase<char,_true>::grow
                  (&RHS->super_SmallVectorTemplateBase<char,_true>,(ulong)uVar10);
        uVar10 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      }
      uVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar10 < uVar2) {
        uVar2 = uVar10;
      }
      Size = (ulong)uVar2;
      uVar8 = 0;
      while( true ) {
        uVar10 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        uVar9 = (ulong)uVar10;
        if (Size == uVar8) {
          uVar3 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          uVar8 = (ulong)uVar3;
          if (uVar3 < uVar10) {
            lVar11 = uVar9 - uVar8;
            if (uVar2 != uVar10) {
              memcpy((void *)(uVar8 + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                            super_SmallVectorTemplateCommon<char,_void>.
                                            super_SmallVectorBase.BeginX),
                     (void *)((long)(this->super_SmallVectorTemplateBase<char,_true>).
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.BeginX + Size),uVar9 - Size);
              uVar8 = (ulong)(RHS->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            }
            SmallVectorBase::set_size((SmallVectorBase *)RHS,lVar11 + uVar8);
          }
          else {
            if (uVar3 <= uVar10) {
              return;
            }
            lVar11 = uVar8 - uVar9;
            if (uVar2 != uVar3) {
              memcpy((void *)(uVar9 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                            super_SmallVectorTemplateCommon<char,_void>.
                                            super_SmallVectorBase.BeginX),
                     (void *)((long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.BeginX + Size),uVar8 - Size);
              uVar9 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            }
            SmallVectorBase::set_size((SmallVectorBase *)this,lVar11 + uVar9);
            this = RHS;
          }
          SmallVectorBase::set_size((SmallVectorBase *)this,Size);
          return;
        }
        if ((uVar9 <= uVar8) ||
           ((RHS->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar8)) break;
        pvVar6 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar7 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        uVar1 = *(undefined1 *)((long)pvVar6 + uVar8);
        *(undefined1 *)((long)pvVar6 + uVar8) = *(undefined1 *)((long)pvVar7 + uVar8);
        *(undefined1 *)((long)pvVar7 + uVar8) = uVar1;
        uVar8 = uVar8 + 1;
      }
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                   );
    }
    (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = pSVar5;
    (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = pSVar4;
    uVar10 = (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size =
         (RHS->super_SmallVectorTemplateBase<char,_true>).
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = uVar10;
    uVar10 = (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
    (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity =
         (RHS->super_SmallVectorTemplateBase<char,_true>).
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
    (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = uVar10;
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->Size, RHS.Size);
    std::swap(this->Capacity, RHS.Capacity);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.set_size(RHS.size() + EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->set_size(NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->set_size(this->size() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.set_size(NumShared);
  }
}